

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

void AddBit(int bit,uchar *bp,uchar **out,size_t *outsize)

{
  uchar *puVar1;
  byte bVar2;
  ulong uVar3;
  
  bVar2 = *bp;
  uVar3 = *outsize;
  if (bVar2 == 0) {
    if ((uVar3 & uVar3 - 1) == 0) {
      if (uVar3 == 0) {
        puVar1 = (uchar *)malloc(1);
        uVar3 = 0;
      }
      else {
        puVar1 = (uchar *)realloc(*out,uVar3 * 2);
        uVar3 = *outsize;
      }
      *out = puVar1;
    }
    else {
      puVar1 = *out;
    }
    puVar1[uVar3] = '\0';
    uVar3 = *outsize + 1;
    *outsize = uVar3;
    bVar2 = *bp;
  }
  (*out)[uVar3 - 1] = (*out)[uVar3 - 1] | (byte)(bit << (bVar2 & 0x1f));
  *bp = *bp + 1 & 7;
  return;
}

Assistant:

static void AddBit(int bit,
                   unsigned char* bp, unsigned char** out, size_t* outsize) {
  if (*bp == 0) ZOPFLI_APPEND_DATA(0, out, outsize);
  (*out)[*outsize - 1] |= bit << *bp;
  *bp = (*bp + 1) & 7;
}